

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
           *this,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  reference pvVar8;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_00;
  uchar *tbs;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  uchar *puVar9;
  uint uVar10;
  array<charls::context_run_mode,_2UL> *this_01;
  size_t in_R8;
  triplet<unsigned_char> local_30 [4];
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aStack_10;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 local_e;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aStack_d;
  undefined1 local_b [2];
  triplet<unsigned_char> rb_local;
  triplet<unsigned_char> ra_local;
  
  this_01 = &this->context_run_mode_;
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  iVar4 = decode_run_interruption_error(this,pvVar8);
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  iVar5 = decode_run_interruption_error(this,pvVar8);
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  uVar6 = decode_run_interruption_error(this,pvVar8);
  tbs = (uchar *)(ulong)uVar6;
  this_00 = &this->traits_;
  this_local._7_1_ = rb.field_0;
  uVar10 = (uint)this_local._7_1_;
  local_e = ra.field_0;
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - local_e.v1),(uchar *)pvVar8,siglen,tbs,in_R8
                      );
  puVar9 = (uchar *)(ulong)uVar10;
  bVar1 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,uVar10,iVar4 * iVar7);
  aStack_10 = rb.field_1;
  uVar10 = (uint)aStack_10.v2;
  aStack_d = ra.field_1;
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar10 - aStack_d.v2),puVar9,siglen_00,tbs,in_R8);
  puVar9 = (uchar *)(ulong)uVar10;
  bVar2 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,uVar10,iVar5 * iVar7);
  iVar7 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)rb.field_2.v3 - (uint)ra.field_2.v3),puVar9,
                       siglen_01,tbs,in_R8);
  bVar3 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::
          compute_reconstructed_sample(this_00,(uint)rb.field_2.v3,uVar6 * iVar7);
  triplet<unsigned_char>::triplet
            ((triplet<unsigned_char> *)local_b,(uint)bVar1,(uint)bVar2,(uint)bVar3);
  local_30[0].field_2.v3 = rb_local.field_0.v1;
  local_30[0].field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)local_b[0];
  local_30[0].field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)local_b[1];
  return local_30[0];
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }